

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeView.cc
# Opt level: O3

vector<NodeView,_std::allocator<NodeView>_> * __thiscall
NodeView::parallels(vector<NodeView,_std::allocator<NodeView>_> *__return_storage_ptr__,
                   NodeView *this)

{
  pointer *ppNVar1;
  iterator __position;
  bool bVar2;
  LinkView *plv;
  pointer pLVar3;
  LinkView *plv_1;
  DistanceGraph *pDVar4;
  pointer pLVar5;
  set<long,_std::less<long>,_std::allocator<long>_> opnodes;
  set<long,_std::less<long>,_std::allocator<long>_> onnodes;
  vector<LinkView,_std::allocator<LinkView>_> n;
  vector<LinkView,_std::allocator<LinkView>_> p;
  set<long,_std::less<long>,_std::allocator<long>_> nnodes;
  set<long,_std::less<long>,_std::allocator<long>_> pnodes;
  vector<LinkView,_std::allocator<LinkView>_> local_170;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_158;
  NodeView local_128;
  undefined1 local_118 [8];
  _Rb_tree_node_base _Stack_110;
  size_t local_f0;
  vector<LinkView,_std::allocator<LinkView>_> local_e8;
  vector<LinkView,_std::allocator<LinkView>_> local_d0;
  vector<LinkView,_std::allocator<LinkView>_> local_b8;
  pointer local_a0;
  NodeView *local_98;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_90;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_60;
  
  prev(&local_b8,this);
  next(&local_d0,this);
  if ((local_b8.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
       super__Vector_impl_data._M_start ==
       local_b8.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     (local_d0.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_d0.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    (__return_storage_ptr__->super__Vector_base<NodeView,_std::allocator<NodeView>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<NodeView,_std::allocator<NodeView>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<NodeView,_std::allocator<NodeView>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    (__return_storage_ptr__->super__Vector_base<NodeView,_std::allocator<NodeView>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<NodeView,_std::allocator<NodeView>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<NodeView,_std::allocator<NodeView>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_90._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_90._M_impl.super__Rb_tree_header._M_header;
    local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_90._M_impl.super__Rb_tree_header._M_header._M_right =
         local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    prev((vector<LinkView,_std::allocator<LinkView>_> *)&local_158,this);
    pLVar5 = (pointer)CONCAT44(local_158._M_impl.super__Rb_tree_header._M_header._4_4_,
                               local_158._M_impl.super__Rb_tree_header._M_header._M_color);
    if ((pointer)local_158._M_impl._0_8_ != pLVar5) {
      pLVar3 = (pointer)local_158._M_impl._0_8_;
      do {
        local_118 = (undefined1  [8])(pLVar3->node_view).id;
        std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
        _M_insert_unique<long>(&local_60,(long *)local_118);
        pLVar3 = pLVar3 + 1;
      } while (pLVar3 != pLVar5);
    }
    if ((pointer)local_158._M_impl._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_158._M_impl._0_8_,
                      (long)local_158._M_impl.super__Rb_tree_header._M_header._M_parent -
                      local_158._M_impl._0_8_);
    }
    next((vector<LinkView,_std::allocator<LinkView>_> *)&local_158,this);
    pLVar5 = (pointer)CONCAT44(local_158._M_impl.super__Rb_tree_header._M_header._4_4_,
                               local_158._M_impl.super__Rb_tree_header._M_header._M_color);
    if ((pointer)local_158._M_impl._0_8_ != pLVar5) {
      pLVar3 = (pointer)local_158._M_impl._0_8_;
      do {
        local_118 = (undefined1  [8])(pLVar3->node_view).id;
        std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
        _M_insert_unique<long>(&local_90,(long *)local_118);
        pLVar3 = pLVar3 + 1;
      } while (pLVar3 != pLVar5);
    }
    if ((pointer)local_158._M_impl._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_158._M_impl._0_8_,
                      (long)local_158._M_impl.super__Rb_tree_header._M_header._M_parent -
                      local_158._M_impl._0_8_);
    }
    prev((vector<LinkView,_std::allocator<LinkView>_> *)&local_158,this);
    local_118 = (undefined1  [8])((NodeView *)local_158._M_impl._0_8_)->id;
    _Stack_110._0_8_ = ((NodeView *)local_158._M_impl._0_8_)->dg;
    next(&local_e8,(NodeView *)local_118);
    if ((pointer)local_158._M_impl._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_158._M_impl._0_8_,
                      (long)local_158._M_impl.super__Rb_tree_header._M_header._M_parent -
                      local_158._M_impl._0_8_);
    }
    if (local_e8.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_e8.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_a0 = local_e8.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      pLVar5 = local_e8.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_98 = this;
      do {
        if (((pLVar5->node_view).id != this->id) || ((pLVar5->node_view).dg != this->dg)) {
          local_158._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_158._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_158._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)((long)&local_158 + 8);
          local_158._M_impl.super__Rb_tree_header._M_node_count = 0;
          _Stack_110._0_8_ = _Stack_110._0_8_ & 0xffffffff00000000;
          _Stack_110._M_parent = (_Base_ptr)0x0;
          _Stack_110._M_left = &_Stack_110;
          local_f0 = 0;
          local_128.id = (pLVar5->node_view).id;
          local_128.dg = (pLVar5->node_view).dg;
          local_158._M_impl.super__Rb_tree_header._M_header._M_right =
               local_158._M_impl.super__Rb_tree_header._M_header._M_left;
          _Stack_110._M_right = _Stack_110._M_left;
          prev(&local_170,&local_128);
          pLVar3 = local_170.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (pDVar4 = (DistanceGraph *)
                        local_170.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                        super__Vector_impl_data._M_start; pDVar4 != (DistanceGraph *)pLVar3;
              pDVar4 = (DistanceGraph *)&(pDVar4->name)._M_string_length) {
            local_128.id = (sgNodeID_t)pDVar4->sdg;
            std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
            ::_M_insert_unique<long>(&local_158,&local_128.id);
          }
          if ((DistanceGraph *)
              local_170.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
              super__Vector_impl_data._M_start != (DistanceGraph *)0x0) {
            operator_delete(local_170.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_170.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_170.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          local_128.id = (pLVar5->node_view).id;
          local_128.dg = (pLVar5->node_view).dg;
          next(&local_170,&local_128);
          pLVar3 = local_170.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (pDVar4 = (DistanceGraph *)
                        local_170.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                        super__Vector_impl_data._M_start; pDVar4 != (DistanceGraph *)pLVar3;
              pDVar4 = (DistanceGraph *)&(pDVar4->name)._M_string_length) {
            local_128.id = (sgNodeID_t)pDVar4->sdg;
            std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
            ::_M_insert_unique<long>
                      ((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                        *)local_118,&local_128.id);
          }
          if ((DistanceGraph *)
              local_170.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
              super__Vector_impl_data._M_start != (DistanceGraph *)0x0) {
            operator_delete(local_170.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_170.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_170.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          this = local_98;
          if ((((local_60._M_impl.super__Rb_tree_header._M_node_count ==
                 local_158._M_impl.super__Rb_tree_header._M_node_count) &&
               (bVar2 = std::__equal<false>::
                        equal<std::_Rb_tree_const_iterator<long>,std::_Rb_tree_const_iterator<long>>
                                  ((_Rb_tree_const_iterator<long>)
                                   local_60._M_impl.super__Rb_tree_header._M_header._M_left,
                                   (_Rb_tree_const_iterator<long>)
                                   &local_60._M_impl.super__Rb_tree_header,
                                   (_Rb_tree_const_iterator<long>)
                                   local_158._M_impl.super__Rb_tree_header._M_header._M_left), bVar2
               )) && (local_90._M_impl.super__Rb_tree_header._M_node_count == local_f0)) &&
             (bVar2 = std::__equal<false>::
                      equal<std::_Rb_tree_const_iterator<long>,std::_Rb_tree_const_iterator<long>>
                                ((_Rb_tree_const_iterator<long>)
                                 local_90._M_impl.super__Rb_tree_header._M_header._M_left,
                                 (_Rb_tree_const_iterator<long>)
                                 &local_90._M_impl.super__Rb_tree_header,
                                 (_Rb_tree_const_iterator<long>)_Stack_110._M_left), bVar2)) {
            local_170.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)(pLVar5->node_view).id;
            local_170.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)(pLVar5->node_view).dg;
            __position._M_current =
                 (__return_storage_ptr__->super__Vector_base<NodeView,_std::allocator<NodeView>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (__return_storage_ptr__->super__Vector_base<NodeView,_std::allocator<NodeView>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<NodeView,std::allocator<NodeView>>::_M_realloc_insert<NodeView_const&>
                        ((vector<NodeView,std::allocator<NodeView>> *)__return_storage_ptr__,
                         __position,(NodeView *)&local_170);
            }
            else {
              (__position._M_current)->id =
                   (sgNodeID_t)
                   local_170.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                   super__Vector_impl_data._M_start;
              (__position._M_current)->dg =
                   (DistanceGraph *)
                   local_170.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              ppNVar1 = &(__return_storage_ptr__->
                         super__Vector_base<NodeView,_std::allocator<NodeView>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppNVar1 = *ppNVar1 + 1;
            }
          }
          std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
          ~_Rb_tree((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                     *)local_118);
          std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
          ~_Rb_tree(&local_158);
          local_e8.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
          super__Vector_impl_data._M_finish = local_a0;
        }
        pLVar5 = pLVar5 + 1;
      } while (pLVar5 != local_e8.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    if (local_e8.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_e8.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_90);
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_60);
  }
  if (local_d0.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b8.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<NodeView> NodeView::parallels() const {
    auto p=prev(),n=next();
    if (p.empty() or n.empty()) return {};
    std::vector<NodeView> pars;
    std::set<sgNodeID_t> pnodes,nnodes;
    for (auto &plv:prev()) pnodes.insert(plv.node().node_id());
    for (auto &nlv:next()) nnodes.insert(nlv.node().node_id());
    for (auto &other:prev()[0].node().next()){
        if (other.node()==*this) continue;
        std::set<sgNodeID_t> opnodes,onnodes;
        for (auto &plv:other.node().prev()) opnodes.insert(plv.node().node_id());
        for (auto &nlv:other.node().next()) onnodes.insert(nlv.node().node_id());
        if (pnodes==opnodes and nnodes==onnodes) pars.push_back(other.node());
    }
    return pars;
}